

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

int Abc_NtkFunctionalIso(Abc_Ntk_t *pNtk,int iCo1,int iCo2,int fCommon)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    iVar1 = Abc_NtkFunctionalIsoInt(pNtk,iCo1,iCo2,fCommon);
    return iVar1;
  }
  pNtk_00 = Abc_NtkStrash(pNtk,0,0,0);
  iVar1 = Abc_NtkFunctionalIsoInt(pNtk_00,iCo1,iCo2,fCommon);
  Abc_NtkDelete(pNtk_00);
  return iVar1;
}

Assistant:

int Abc_NtkFunctionalIso( Abc_Ntk_t * pNtk, int iCo1, int iCo2, int fCommon )
{
    Abc_Ntk_t * pNtkNew; int Result;
    if ( Abc_NtkIsStrash(pNtk) )
        return Abc_NtkFunctionalIsoInt( pNtk, iCo1, iCo2, fCommon );
    pNtkNew = Abc_NtkStrash( pNtk, 0, 0, 0 );
    Result = Abc_NtkFunctionalIsoInt( pNtkNew, iCo1, iCo2, fCommon );
    Abc_NtkDelete( pNtkNew );
    return Result;
}